

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

Cord * __thiscall
google::protobuf::Reflection::GetRaw<absl::lts_20240722::Cord>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t offset;
  DescriptorStringView psVar2;
  LogMessage *pLVar3;
  bool local_91;
  uint32_t field_offset;
  char *local_80;
  LogMessageFatal local_78 [19];
  Voidify local_65 [20];
  byte local_51;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  local_51 = 0;
  local_91 = true;
  if (bVar1) {
    local_91 = HasOneofField(this,(Message *)field_local,local_28);
  }
  if (((local_91 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"!schema_.InRealOneof(field) || HasOneofField(message, field)");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message.h"
               ,0x659,local_50._M_len,local_50._M_str);
    local_51 = 1;
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [9])"Field = ");
    psVar2 = FieldDescriptor::full_name_abi_cxx11_(local_28);
    pLVar3 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar3,(string *)psVar2);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar3);
  }
  if ((local_51 & 1) == 0) {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = internal::ReflectionSchema::IsSplit(&this->schema_,local_28);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&field_offset,
                   "!schema_.IsSplit(field)");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message.h"
                   ,0x661,_field_offset,local_80);
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_78);
        absl::lts_20240722::log_internal::Voidify::operator&&(local_65,pLVar3);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
      }
      offset = internal::ReflectionSchema::GetFieldOffset(&this->schema_,local_28);
      this_local = (Reflection *)
                   internal::GetConstRefAtOffset<absl::lts_20240722::Cord>
                             ((Message *)field_local,offset);
    }
    else {
      this_local = (Reflection *)
                   GetRawNonOneof<absl::lts_20240722::Cord>(this,(Message *)field_local,local_28);
    }
    return (Cord *)this_local;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();

  if (PROTOBUF_PREDICT_TRUE(!schema_.InRealOneof(field))) {
    return GetRawNonOneof<Type>(message, field);
  }

  // Oneof fields are not split.
  ABSL_DCHECK(!schema_.IsSplit(field));

  const uint32_t field_offset = schema_.GetFieldOffset(field);
  return internal::GetConstRefAtOffset<Type>(message, field_offset);
}